

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typeof.cpp
# Opt level: O0

void __thiscall anon_unknown.dwarf_2140a1b::TypeInfos::reference(TypeInfos *this)

{
  TypeInfos *this_local;
  memory_order __b;
  
  std::operator&(memory_order_seq_cst,__memory_order_mask);
  if ((this->refcount).super___atomic_base<unsigned_long>._M_i == 0) {
    __assert_fail("refcount.load() > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmcppdap/src/typeof.cpp"
                  ,0x1f,"void (anonymous namespace)::TypeInfos::reference()");
  }
  std::__atomic_base<unsigned_long>::operator++
            (&(this->refcount).super___atomic_base<unsigned_long>,0);
  return;
}

Assistant:

inline void reference() {
    assert(refcount.load() > 0);
    refcount++;
  }